

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture1DArrayView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ReferenceParams *pRVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  int z;
  int lodOffsNdx;
  long lVar10;
  int y;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  uint uVar22;
  float fVar23;
  float fVar24;
  uint uVar30;
  undefined1 auVar25 [16];
  float fVar31;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  Texture1DArrayView TVar43;
  Vector<bool,_4> res;
  Vec4 resPix;
  Vec3 triT [2];
  Vec2 lodBounds;
  Vec3 triS [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture1DArrayView src;
  Vec2 clampedLod;
  float local_254;
  undefined1 local_248 [16];
  Vec2 local_238;
  float local_22c;
  Vec4 local_228;
  float local_218 [6];
  PixelBufferAccess *local_200;
  ReferenceParams *local_1f8;
  ulong local_1f0;
  float local_1e8;
  undefined8 local_1e4;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  Sampler *local_180;
  ConstPixelBufferAccess *local_178;
  Vec2 local_170;
  float local_168;
  float fStack_164;
  float afStack_160 [2];
  undefined8 local_158;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_148;
  undefined1 local_128 [16];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  Texture1DArrayView local_108;
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8;
  float fStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58 [8];
  tcu local_38 [8];
  undefined1 auVar29 [16];
  
  local_148.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180 = &sampleParams->sampler;
  local_200 = errorMask;
  local_178 = reference;
  TVar43 = tcu::getEffectiveTextureView(baseView,&local_148,local_180);
  local_108.m_levels = TVar43.m_levels;
  local_108.m_numLevels = TVar43.m_numLevels;
  local_1e8 = *texCoord;
  local_218[0] = texCoord[1];
  local_1e4._0_4_ = texCoord[2];
  local_1e4._4_4_ = texCoord[4];
  local_1dc = texCoord[6];
  local_218[1] = texCoord[3];
  local_218[2] = texCoord[5];
  local_218[3] = texCoord[7];
  local_1c8 = ZEXT816(0);
  local_1a8 = ZEXT816(0);
  if (0 < local_108.m_numLevels) {
    local_1a8 = ZEXT416((uint)(float)((local_108.m_levels)->m_size).m_data[0]);
  }
  fVar33 = (float)(result->m_size).m_data[0];
  fVar34 = (float)(result->m_size).m_data[1];
  local_168 = (sampleParams->super_RenderParams).w.m_data[0];
  fStack_164 = (sampleParams->super_RenderParams).w.m_data[1];
  afStack_160[0] = (sampleParams->super_RenderParams).w.m_data[2];
  afStack_160[1] = (sampleParams->super_RenderParams).w.m_data[3];
  local_158 = CONCAT44(fStack_164,afStack_160[0]);
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    local_1c8 = ZEXT416((uint)(sampleParams->super_RenderParams).bias);
  }
  local_58[0] = -1.0;
  local_58[1] = 0.0;
  local_58[2] = 1.0;
  local_58[3] = 0.0;
  local_58[4] = 0.0;
  local_58[5] = -1.0;
  local_58[6] = 0.0;
  local_58[7] = 1.0;
  local_248._0_4_ = 0xff00ff00;
  local_218[4] = local_218[2];
  local_218[5] = local_218[1];
  local_1d8 = local_1e4._4_4_;
  local_1d4 = (float)local_1e4;
  tcu::RGBA::toVec((RGBA *)local_248);
  tcu::clear(local_200,&local_228);
  if ((result->m_size).m_data[1] < 1) {
    iVar8 = 0;
  }
  else {
    local_1c8._4_4_ = local_1c8._0_4_;
    local_1c8._8_4_ = local_1c8._0_4_;
    local_1c8._12_4_ = local_1c8._0_4_;
    iVar8 = 0;
    z = 0;
    local_1f8 = sampleParams;
    do {
      if (watchDog != (qpWatchDog *)0x0) {
        qpWatchDog_touch(watchDog);
      }
      if (0 < (result->m_size).m_data[0]) {
        fVar14 = (float)z + 0.5;
        local_22c = fVar34 - fVar14;
        local_128 = ZEXT416((uint)(fVar14 / fVar34));
        local_f8 = ZEXT416((uint)(1.0 - fVar14 / fVar34));
        y = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_248,(int)result,y,z)
          ;
          pRVar6 = local_1f8;
          auVar36._0_4_ =
               (float)local_248._0_4_ - (local_1f8->super_RenderParams).colorBias.m_data[0];
          auVar36._4_4_ =
               (float)local_248._4_4_ - (local_1f8->super_RenderParams).colorBias.m_data[1];
          auVar36._8_4_ =
               (float)local_248._8_4_ - (local_1f8->super_RenderParams).colorBias.m_data[2];
          auVar36._12_4_ =
               (float)local_248._12_4_ - (local_1f8->super_RenderParams).colorBias.m_data[3];
          local_228.m_data =
               (float  [4])
               divps(auVar36,*(undefined1 (*) [16])(local_1f8->super_RenderParams).colorScale.m_data
                    );
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_248,(int)local_178,y,z);
          auVar38._0_4_ = (float)local_248._0_4_ - (pRVar6->super_RenderParams).colorBias.m_data[0];
          auVar38._4_4_ = (float)local_248._4_4_ - (pRVar6->super_RenderParams).colorBias.m_data[1];
          auVar38._8_4_ = (float)local_248._8_4_ - (pRVar6->super_RenderParams).colorBias.m_data[2];
          auVar38._12_4_ =
               (float)local_248._12_4_ - (pRVar6->super_RenderParams).colorBias.m_data[3];
          auVar11 = divps(auVar38,*(undefined1 (*) [16])
                                   (pRVar6->super_RenderParams).colorScale.m_data);
          fVar15 = local_228.m_data[0] - auVar11._0_4_;
          fVar16 = local_228.m_data[1] - auVar11._4_4_;
          fVar17 = local_228.m_data[2] - auVar11._8_4_;
          fVar18 = local_228.m_data[3] - auVar11._12_4_;
          auVar12._0_8_ = CONCAT44(fVar16,fVar15) ^ 0x8000000080000000;
          auVar12._8_4_ = -fVar17;
          auVar12._12_4_ = -fVar18;
          auVar11._4_4_ = fVar16;
          auVar11._0_4_ = fVar15;
          auVar11._8_4_ = fVar17;
          auVar11._12_4_ = fVar18;
          auVar11 = maxps(auVar12,auVar11);
          auVar13._4_4_ = -(uint)(auVar11._4_4_ <= (lookupPrec->colorThreshold).m_data[1]);
          auVar13._0_4_ = -(uint)(auVar11._0_4_ <= (lookupPrec->colorThreshold).m_data[0]);
          auVar13._8_4_ = -(uint)(auVar11._8_4_ <= (lookupPrec->colorThreshold).m_data[2]);
          auVar13._12_4_ = -(uint)(auVar11._12_4_ <= (lookupPrec->colorThreshold).m_data[3]);
          auVar11 = packssdw(auVar13,auVar13);
          auVar11 = packsswb(auVar11,auVar11);
          local_248._0_4_ = SUB164(auVar11 & _DAT_00967bd0,0);
          if (SUB161(auVar11 & _DAT_00967bd0,0) == '\0') {
LAB_00840081:
            fVar16 = (float)y + 0.5;
            fVar17 = fVar16 / fVar33;
            bVar7 = 1.0 <= (float)local_128._0_4_ + fVar17;
            fVar15 = fVar14;
            local_254 = fVar16;
            if (bVar7) {
              fVar15 = local_22c;
              local_254 = fVar33 - fVar16;
            }
            lVar10 = (ulong)((uint)bVar7 * 4) * 3;
            fVar18 = *(float *)((long)&local_1e8 + lVar10);
            fVar40 = (float)*(undefined8 *)((long)&local_1e4 + lVar10);
            fVar42 = (float)((ulong)*(undefined8 *)((long)&local_1e4 + lVar10) >> 0x20);
            fVar32 = *(float *)((long)afStack_160 + lVar10);
            uVar9 = *(ulong *)((long)&local_168 + lVar10);
            fVar41 = (float)uVar9;
            fStack_a4 = (float)(uVar9 >> 0x20);
            auVar20._8_8_ = 0;
            auVar20._0_8_ = *(ulong *)((long)afStack_160 + lVar10 + -4);
            uVar22 = (int)((uint)bVar7 << 0x1f) >> 0x1f;
            uVar30 = (int)((uint)bVar7 << 0x1f) >> 0x1f;
            auVar25._0_4_ = ~uVar22 & local_128._0_4_;
            auVar25._4_4_ = ~uVar30 & (uint)fVar17;
            auVar25._8_4_ = local_128._8_4_;
            auVar25._12_4_ = local_128._12_4_;
            auVar3._4_4_ = (uint)(1.0 - fVar17) & uVar30;
            auVar3._0_4_ = local_f8._0_4_ & uVar22;
            auVar3._8_8_ = 0;
            auVar25 = auVar25 | auVar3;
            fVar23 = auVar25._0_4_;
            fVar31 = auVar25._4_4_;
            fVar19 = auVar25._8_4_;
            fVar24 = auVar25._12_4_;
            fVar17 = (1.0 - fVar31) - fVar23;
            auVar35._0_4_ = fVar18 * fVar17;
            auVar35._4_4_ = *(float *)((long)local_218 + lVar10 + 4) * fVar23;
            auVar35._8_4_ = fVar19 * 0.0;
            auVar35._12_4_ = fVar24 * 0.0;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = uVar9;
            auVar36 = divps(auVar35,auVar2);
            auVar11 = divps(auVar25,auVar20);
            auVar26._4_4_ = auVar11._4_4_;
            auVar26._0_4_ = auVar26._4_4_;
            auVar26._8_4_ = auVar26._4_4_;
            auVar26._12_4_ = auVar26._4_4_;
            auVar27._4_12_ = auVar26._4_12_;
            auVar27._0_4_ = auVar26._4_4_ + fVar17 / fVar41 + auVar11._0_4_;
            auVar21._0_4_ = fVar40 * fVar23;
            auVar21._4_4_ = *(float *)((long)local_218 + lVar10) * fVar17;
            auVar21._8_4_ = fVar19 * 0.0;
            auVar21._12_4_ = fVar24 * 0.0;
            auVar5._4_4_ = fVar41;
            auVar5._0_4_ = fStack_a4;
            auVar5._8_8_ = 0;
            auVar11 = divps(auVar21,auVar5);
            auVar37._0_4_ = fVar42 * fVar31;
            auVar37._4_4_ = *(float *)((long)local_218 + lVar10 + 8) * fVar31;
            auVar37._8_4_ = fVar42 * fVar31;
            auVar37._12_4_ = fVar42 * fVar31;
            auVar4._4_4_ = fVar32;
            auVar4._0_4_ = fVar32;
            auVar4._8_8_ = 0;
            auVar38 = divps(auVar37,auVar4);
            auVar39._0_4_ = auVar38._0_4_ + auVar36._0_4_ + auVar11._0_4_;
            auVar39._4_4_ = auVar38._4_4_ + auVar36._4_4_ + auVar11._4_4_;
            auVar39._8_4_ = auVar38._8_4_ + auVar36._8_4_ + auVar11._8_4_;
            auVar39._12_4_ = auVar38._12_4_ + auVar36._12_4_ + auVar11._12_4_;
            auVar29._0_8_ = auVar27._0_8_;
            auVar29._8_4_ = auVar26._4_4_;
            auVar29._12_4_ = auVar26._4_4_;
            auVar28._8_8_ = auVar29._8_8_;
            auVar28._4_4_ = auVar27._0_4_;
            auVar28._0_4_ = auVar27._0_4_;
            auVar11 = divps(auVar39,auVar28);
            local_170.m_data = auVar11._0_8_;
            local_98 = ZEXT416((uint)(fVar32 * fVar33));
            local_198 = fVar32 * fVar33 * fVar23 + fVar16 * fStack_a4;
            fStack_194 = (fVar40 - fVar18) * fVar32 + (fVar42 - fVar40) * fVar41;
            fStack_190 = fVar19 * 0.0 + 0.0;
            fStack_18c = fVar42 * fVar24 + fVar42 * 0.0;
            local_a8 = fStack_a4 * fVar34;
            local_b8 = -fVar41;
            fStack_b4 = -fStack_a4;
            fVar17 = fVar41 * fStack_a4 * fVar32;
            local_118 = fVar32 * fStack_a4;
            fStack_114 = (fVar18 - fVar42) * fStack_a4;
            fStack_110 = fStack_a4 * 0.0;
            fStack_10c = fStack_a4 * 0.0;
            uStack_b0 = 0x80000000;
            uStack_ac = 0x80000000;
            fVar24 = (fVar33 * (fVar23 + -1.0) + fVar16) * local_118 + local_b8 * local_198;
            fVar16 = fVar17 * fVar33;
            local_d8 = CONCAT44(fStack_a4,fVar16);
            uStack_d0 = 0;
            fVar19 = (fVar34 * (fVar31 + -1.0) + fVar14) * local_118 -
                     (local_a8 * fVar31 + fVar14 * fVar32) * fVar41;
            fVar41 = (fVar40 - fVar42) * fVar41 + (fVar42 - fVar18) * fStack_a4;
            local_78 = ZEXT416((uint)fVar32);
            fVar32 = (fVar18 - fVar40) * fVar32;
            local_68 = CONCAT44(fVar42,fVar41);
            uStack_60 = 0;
            local_1b8 = ZEXT416((uint)fVar32);
            fVar17 = fVar17 * fVar34;
            local_c8 = CONCAT44(fStack_a4,fVar17);
            uStack_c0 = 0;
            fStack_a0 = fStack_a4;
            fStack_9c = fStack_a4;
            local_88 = fStack_a4;
            fStack_84 = fStack_a4;
            fStack_80 = fStack_a4;
            fStack_7c = fStack_a4;
            tcu::computeLodBoundsFromDerivates
                      ((tcu *)&local_1f0,
                       ((fVar16 * ((fVar23 + -1.0) * fStack_114 + fVar23 * fStack_194)) /
                       (fVar24 * fVar24)) * (float)local_1a8._0_4_,
                       ((((fVar31 + -1.0) * fVar32 + fVar31 * fVar41) * fVar17) / (fVar19 * fVar19))
                       * (float)local_1a8._0_4_,lodPrec);
            local_e8 = fStack_114;
            fStack_e4 = fStack_114;
            fStack_e0 = fStack_114;
            fStack_dc = fStack_114;
            lVar10 = 0;
            local_198 = fStack_194;
            fStack_190 = fStack_194;
            fStack_18c = fStack_194;
            do {
              fVar16 = local_58[lVar10 * 2] + local_254;
              fVar18 = local_58[lVar10 * 2 + 1] + fVar15;
              fVar32 = fVar18 / fVar34;
              fVar17 = fVar16 / fVar33;
              fVar41 = (fVar33 * (fVar32 + -1.0) + fVar16) * local_118 +
                       ((float)local_98._0_4_ * fVar32 + fVar16 * local_88) * local_b8;
              fVar16 = (fVar34 * (fVar17 + -1.0) + fVar18) * local_118 +
                       (local_a8 * fVar17 + fVar18 * (float)local_78._0_4_) * local_b8;
              tcu::computeLodBoundsFromDerivates
                        ((tcu *)local_248,
                         ((((fVar32 + -1.0) * local_e8 + fVar32 * local_198) * (float)local_d8) /
                         (fVar41 * fVar41)) * (float)local_1a8._0_4_,
                         ((((fVar17 + -1.0) * (float)local_1b8._0_4_ + fVar17 * (float)local_68) *
                          (float)local_c8) / (fVar16 * fVar16)) * (float)local_1a8._0_4_,lodPrec);
              fVar16 = (float)(local_1f0 >> 0x20);
              uVar22 = -(uint)((float)local_1f0 <= (float)local_248._0_8_);
              uVar30 = -(uint)(SUB84(local_248._0_8_,4) <= fVar16);
              local_1f0 = CONCAT44(~uVar30 & (uint)SUB84(local_248._0_8_,4),
                                   ~uVar22 & (uint)(float)local_248._0_8_) |
                          CONCAT44((uint)fVar16 & uVar30,(uint)(float)local_1f0 & uVar22);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_248._0_4_ = (float)local_1f0 + (float)local_1c8._0_4_;
            local_248._4_4_ = (float)(local_1f0 >> 0x20) + (float)local_1c8._4_4_;
            local_238.m_data[0] = local_1f8->minLod;
            local_238.m_data[1] = local_1f8->maxLod;
            tcu::clampLodBounds(local_38,(Vec2 *)local_248,&local_238,lodPrec);
            bVar7 = tcu::isLookupResultValid
                              (&local_108,local_180,lookupPrec,&local_170,(Vec2 *)local_38,
                               &local_228);
            if (!bVar7) {
              local_238.m_data[0] = -1.7014636e+38;
              tcu::RGBA::toVec((RGBA *)&local_238);
              tcu::PixelBufferAccess::setPixel(local_200,(Vec4 *)local_248,y,z,0);
              iVar8 = iVar8 + 1;
            }
          }
          else {
            uVar9 = 0xffffffffffffffff;
            do {
              if (uVar9 == 2) goto LAB_0084066c;
              uVar1 = uVar9 + 1;
              lVar10 = uVar9 + 2;
              uVar9 = uVar1;
            } while (local_248[lVar10] != '\0');
            if (uVar1 < 3) goto LAB_00840081;
          }
LAB_0084066c:
          y = y + 1;
        } while (y < (result->m_size).m_data[0]);
      }
      z = z + 1;
    } while (z < (result->m_size).m_data[1]);
  }
  if (local_148.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar8;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture1DArrayView&		baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture1DArrayView				src					= getEffectiveTextureView(baseView, srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[2+0], texCoord[4+0], texCoord[6+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[2+1], texCoord[4+1], texCoord[6+1]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const float									srcSize				= float(src.getWidth()); // For lod computation, thus #layers is ignored.

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec2	coord	(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
										 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy));
				const float	coordDx		= triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy) * srcSize;
				const float	coordDy		= triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx) * srcSize;

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx, coordDy, lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const float	coordDxo		= triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo) * srcSize;
					const float	coordDyo		= triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo) * srcSize;
					const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo, coordDyo, lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix);

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}